

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void conn_free(connectdata *conn)

{
  char *pcVar1;
  
  if (conn != (connectdata *)0x0) {
    if (conn->sock[1] != -1) {
      Curl_closesocket(conn,conn->sock[1]);
    }
    if (conn->sock[0] != -1) {
      Curl_closesocket(conn,conn->sock[0]);
    }
    if (conn->user != (char *)0x0) {
      (*Curl_cfree)(conn->user);
      conn->user = (char *)0x0;
    }
    if (conn->passwd != (char *)0x0) {
      (*Curl_cfree)(conn->passwd);
      conn->passwd = (char *)0x0;
    }
    if (conn->proxyuser != (char *)0x0) {
      (*Curl_cfree)(conn->proxyuser);
      conn->proxyuser = (char *)0x0;
    }
    if (conn->proxypasswd != (char *)0x0) {
      (*Curl_cfree)(conn->proxypasswd);
      conn->proxypasswd = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).proxyuserpwd;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).uagent;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).uagent = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).userpwd;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).userpwd = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).accept_encoding;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).accept_encoding = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).te;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).te = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).rangeline;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).rangeline = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).ref;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).ref = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).host;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).host = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).cookiehost;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).cookiehost = (char *)0x0;
    }
    pcVar1 = (conn->allocptr).rtsp_transport;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->allocptr).rtsp_transport = (char *)0x0;
    }
    if (conn->trailer != (char *)0x0) {
      (*Curl_cfree)(conn->trailer);
      conn->trailer = (char *)0x0;
    }
    pcVar1 = (conn->host).rawalloc;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->host).rawalloc = (char *)0x0;
    }
    pcVar1 = (conn->proxy).rawalloc;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (conn->proxy).rawalloc = (char *)0x0;
    }
    if (conn->master_buffer != (char *)0x0) {
      (*Curl_cfree)(conn->master_buffer);
      conn->master_buffer = (char *)0x0;
    }
    Curl_llist_destroy(conn->send_pipe,(void *)0x0);
    Curl_llist_destroy(conn->recv_pipe,(void *)0x0);
    Curl_llist_destroy(conn->pend_pipe,(void *)0x0);
    Curl_llist_destroy(conn->done_pipe,(void *)0x0);
    conn->pend_pipe = (curl_llist *)0x0;
    conn->done_pipe = (curl_llist *)0x0;
    conn->send_pipe = (curl_llist *)0x0;
    conn->recv_pipe = (curl_llist *)0x0;
    if (conn->localdev != (char *)0x0) {
      (*Curl_cfree)(conn->localdev);
      conn->localdev = (char *)0x0;
    }
    Curl_free_ssl_config(&conn->ssl_config);
    (*Curl_cfree)(conn);
    return;
  }
  return;
}

Assistant:

static void conn_free(struct connectdata *conn)
{
  if(!conn)
    return;

  /* possible left-overs from the async name resolvers */
  Curl_resolver_cancel(conn);

  /* close the SSL stuff before we close any sockets since they will/may
     write to the sockets */
  Curl_ssl_close(conn, FIRSTSOCKET);
  Curl_ssl_close(conn, SECONDARYSOCKET);

  /* close possibly still open sockets */
  if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET])
    Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
  if(CURL_SOCKET_BAD != conn->sock[FIRSTSOCKET])
    Curl_closesocket(conn, conn->sock[FIRSTSOCKET]);

#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  Curl_ntlm_wb_cleanup(conn);
#endif

  Curl_safefree(conn->user);
  Curl_safefree(conn->passwd);
  Curl_safefree(conn->proxyuser);
  Curl_safefree(conn->proxypasswd);
  Curl_safefree(conn->allocptr.proxyuserpwd);
  Curl_safefree(conn->allocptr.uagent);
  Curl_safefree(conn->allocptr.userpwd);
  Curl_safefree(conn->allocptr.accept_encoding);
  Curl_safefree(conn->allocptr.te);
  Curl_safefree(conn->allocptr.rangeline);
  Curl_safefree(conn->allocptr.ref);
  Curl_safefree(conn->allocptr.host);
  Curl_safefree(conn->allocptr.cookiehost);
  Curl_safefree(conn->allocptr.rtsp_transport);
  Curl_safefree(conn->trailer);
  Curl_safefree(conn->host.rawalloc); /* host name buffer */
  Curl_safefree(conn->proxy.rawalloc); /* proxy name buffer */
  Curl_safefree(conn->master_buffer);

  Curl_llist_destroy(conn->send_pipe, NULL);
  Curl_llist_destroy(conn->recv_pipe, NULL);
  Curl_llist_destroy(conn->pend_pipe, NULL);
  Curl_llist_destroy(conn->done_pipe, NULL);

  conn->send_pipe = NULL;
  conn->recv_pipe = NULL;
  conn->pend_pipe = NULL;
  conn->done_pipe = NULL;

  Curl_safefree(conn->localdev);
  Curl_free_ssl_config(&conn->ssl_config);

  free(conn); /* free all the connection oriented data */
}